

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O0

void Gla_ManStop(Gla_Man_t *p)

{
  Gla_Obj_t *pGVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int local_1c;
  Gla_Obj_t *pGStack_18;
  int i;
  Gla_Obj_t *pGla;
  Gla_Man_t *p_local;
  
  if (p->pPars->fVerbose != 0) {
    uVar2 = sat_solver2_nvars(p->pSat);
    uVar3 = sat_solver2_nclauses(p->pSat);
    uVar4 = sat_solver2_nconflicts(p->pSat);
    uVar5 = sat_solver2_nlearnts(p->pSat);
    Abc_Print(1,
              "SAT solver:  Var = %d  Cla = %d  Conf = %d  Lrn = %d  Reduce = %d  Cex = %d  Objs+ = %d\n"
              ,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,(ulong)uVar5,p->pSat->nDBreduces,p->nCexes,
              p->nObjAdded);
  }
  Rnm_ManStop(p->pRnm,0);
  if (p->pvRefis != (Vec_Int_t *)0x0) {
    for (local_1c = 0; iVar6 = Gia_ManObjNum(p->pGia), local_1c < iVar6; local_1c = local_1c + 1) {
      if (p->pvRefis[local_1c].pArray != (int *)0x0) {
        free(p->pvRefis[local_1c].pArray);
        p->pvRefis[local_1c].pArray = (int *)0x0;
      }
    }
  }
  pGStack_18 = p->pObjs;
  while (pGVar1 = pGStack_18, pGStack_18 = pGVar1 + 1, pGStack_18 < p->pObjs + p->nObjs) {
    if (pGVar1[1].vFrames.pArray != (int *)0x0) {
      free(pGVar1[1].vFrames.pArray);
      pGVar1[1].vFrames.pArray = (int *)0x0;
    }
  }
  Cnf_DataFree(p->pCnf);
  if (p->pGia0 != (Gia_Man_t *)0x0) {
    Gia_ManStop(p->pGia);
  }
  sat_solver2_delete(p->pSat);
  Vec_IntFreeP(&p->vObjCounts);
  Vec_IntFreeP(&p->vAddedNew);
  Vec_IntFreeP(&p->vCoreCounts);
  Vec_IntFreeP(&p->vProofIds);
  Vec_IntFreeP(&p->vTemp);
  Vec_IntFreeP(&p->vAbs);
  if (p->pvRefis != (Vec_Int_t *)0x0) {
    free(p->pvRefis);
    p->pvRefis = (Vec_Int_t *)0x0;
  }
  if (p->pObj2Obj != (uint *)0x0) {
    free(p->pObj2Obj);
    p->pObj2Obj = (uint *)0x0;
  }
  if (p->pObjs != (Gla_Obj_t *)0x0) {
    free(p->pObjs);
    p->pObjs = (Gla_Obj_t *)0x0;
  }
  if (p != (Gla_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Gla_ManStop( Gla_Man_t * p )
{
    Gla_Obj_t * pGla;
    int i;

    if ( p->pPars->fVerbose )
        Abc_Print( 1, "SAT solver:  Var = %d  Cla = %d  Conf = %d  Lrn = %d  Reduce = %d  Cex = %d  Objs+ = %d\n", 
            sat_solver2_nvars(p->pSat), sat_solver2_nclauses(p->pSat), sat_solver2_nconflicts(p->pSat), 
            sat_solver2_nlearnts(p->pSat), p->pSat->nDBreduces, p->nCexes, p->nObjAdded );

    // stop the refinement manager
//    Gia_ManStopP( &p->pGia2 );
    Rnm_ManStop( p->pRnm, 0 );

    if ( p->pvRefis )
    for ( i = 0; i < Gia_ManObjNum(p->pGia); i++ )
        ABC_FREE( p->pvRefis[i].pArray );
    Gla_ManForEachObj( p, pGla )
        ABC_FREE( pGla->vFrames.pArray );
    Cnf_DataFree( p->pCnf );
    if ( p->pGia0 != NULL )
        Gia_ManStop( p->pGia );
//    Gia_ManStaticFanoutStart( p->pGia0 );
    sat_solver2_delete( p->pSat );
    Vec_IntFreeP( &p->vObjCounts );
    Vec_IntFreeP( &p->vAddedNew );
    Vec_IntFreeP( &p->vCoreCounts );
    Vec_IntFreeP( &p->vProofIds );
    Vec_IntFreeP( &p->vTemp );
    Vec_IntFreeP( &p->vAbs );
    ABC_FREE( p->pvRefis );
    ABC_FREE( p->pObj2Obj );
    ABC_FREE( p->pObjs );
    ABC_FREE( p );
}